

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_integer_abi_cxx11_
          (result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  const_iterator l;
  char cVar1;
  const_iterator f;
  int iVar2;
  value_type *pvVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  detail *ctx;
  pair<long,_toml::detail::region> *this_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  allocator_type local_37a;
  allocator<char> local_379;
  string str;
  undefined1 local_358 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_340;
  undefined1 local_338 [32];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_318;
  result<toml::detail::region,_toml::detail::none_t> token;
  integer retval;
  undefined1 local_2a8 [8];
  region local_2a0;
  string local_258;
  undefined1 local_238 [112];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  istringstream iss;
  undefined7 uStack_1a7;
  region local_1a0 [5];
  
  f._M_current = *(char **)(this + 0x40);
  if ((f._M_current != *(char **)(*(long *)(this + 8) + 8)) && (*f._M_current == '0')) {
    l._M_current = f._M_current + 1;
    if (l._M_current == *(char **)(*(long *)(this + 8) + 8)) {
      location::advance((location *)this,1);
      region::region((region *)&token,(location *)this,(const_iterator)f._M_current,l);
      local_238._0_4_ = 0;
      region::region((region *)(local_238 + 8),(region *)&token);
      std::pair<int,_toml::detail::region>::pair
                ((pair<int,_toml::detail::region> *)&iss,
                 (pair<int,_toml::detail::region> *)local_238);
      result<std::pair<long,toml::detail::region>,std::__cxx11::string>::
      result<std::pair<int,toml::detail::region>>
                ((result<std::pair<long,toml::detail::region>,std::__cxx11::string> *)
                 __return_storage_ptr__,(success<std::pair<int,_toml::detail::region>_> *)&iss);
      region::~region(local_1a0);
      region::~region((region *)(local_238 + 8));
      region::~region((region *)&token);
      return __return_storage_ptr__;
    }
    cVar1 = *l._M_current;
    if (cVar1 == 'x') {
      parse_hexadecimal_integer_abi_cxx11_(__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if (cVar1 == 'o') {
      parse_octal_integer_abi_cxx11_(__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if (cVar1 == 'b') {
      parse_binary_integer_abi_cxx11_(__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if ((int)cVar1 - 0x30U < 10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,"toml::parse_integer: leading zero in an Integer is not allowed.",
                 (allocator<char> *)&local_258);
      source_location::source_location((source_location *)local_238,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[13],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&iss,(source_location *)local_238,(char (*) [13])0x186330);
      __l._M_len = 1;
      __l._M_array = (iterator)&iss;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_358,__l,(allocator_type *)&local_318);
      local_338._0_8_ = (pointer)0x0;
      local_338._8_8_ = (pointer)0x0;
      local_338._16_8_ = (pointer)0x0;
      format_underline((string *)local_2a8,&str,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_358,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_338,false);
      goto LAB_0012a77d;
    }
    iVar2 = isalpha((int)cVar1);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,"toml::parse_integer: unknown integer prefix appeared.",
                 (allocator<char> *)&local_258);
      source_location::source_location((source_location *)local_238,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[19],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&iss,(source_location *)local_238,(char (*) [19])"none of 0x, 0o, 0b");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&iss;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_358,__l_00,(allocator_type *)&local_318);
      local_338._0_8_ = (pointer)0x0;
      local_338._8_8_ = (pointer)0x0;
      local_338._16_8_ = (pointer)0x0;
      format_underline((string *)local_2a8,&str,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_358,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_338,false);
      goto LAB_0012a77d;
    }
  }
  ctx = this;
  sequence<toml::detail::maybe<toml::detail::either<toml::detail::character<'+'>,_toml::detail::character<'-'>_>_>,_toml::detail::either<toml::detail::sequence<toml::detail::in_range<'1',_'9'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::sequence<toml::detail::character<'_'>,_toml::detail::in_range<'0',_'9'>_>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::in_range<'0',_'9'>_>_>
  ::invoke(&token,(location *)this);
  if (token.is_ok_ == true) {
    pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
    region::str_abi_cxx11_(&str,pvVar3);
    iss = (istringstream)0x5f;
    _Var4 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_equals_val<const_char>)&iss);
    std::__cxx11::string::erase(&str,_Var4._M_current,str._M_dataplus._M_p + str._M_string_length);
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&str,_S_in);
    std::istream::_M_extract<long>((long *)&iss);
    if ((*(byte *)((long)&local_1a0[0].source_name_._M_dataplus._M_p +
                  *(long *)(CONCAT71(uStack_1a7,iss) + -0x18)) & 5) == 0) {
      pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
      local_2a8 = (undefined1  [8])0x0;
      region::region(&local_2a0,pvVar3);
      this_00 = (pair<long,_toml::detail::region> *)local_238;
      std::pair<long,_toml::detail::region>::pair
                (this_00,(pair<long,_toml::detail::region> *)local_2a8);
      result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,(success_type *)this_00);
      region::~region((region *)(local_238 + 8));
      region::~region(&local_2a0);
    }
    else {
      location::reset((location *)this,f);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"toml::parse_integer:",&local_379);
      source_location::source_location((source_location *)local_2a8,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[13],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_238,(source_location *)local_2a8,(char (*) [13])"out of range");
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_238;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_318,__l_01,&local_37a);
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_338,&local_258,&local_318,&local_1c8,false);
      local_358._0_8_ = local_358 + 0x10;
      if ((pointer)local_338._0_8_ == (pointer)(local_338 + 0x10)) {
        _Stack_340._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._24_8_;
      }
      else {
        local_358._0_8_ = local_338._0_8_;
      }
      local_358._8_8_ = local_338._8_8_;
      local_338._8_8_ = (pointer)0x0;
      local_338._16_8_ = local_338._16_8_ & 0xffffffffffffff00;
      this_00 = (pair<long,_toml::detail::region> *)local_358;
      local_338._0_8_ = (pointer)(local_338 + 0x10);
      result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,(failure_type *)local_358);
      std::__cxx11::string::~string((string *)local_358);
      std::__cxx11::string::~string((string *)local_338);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c8);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_318);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_238);
      source_location::~source_location((source_location *)local_2a8);
      std::__cxx11::string::~string((string *)&local_258);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    std::__cxx11::string::~string((string *)&str);
    result<toml::detail::region,_toml::detail::none_t>::cleanup(&token,(EVP_PKEY_CTX *)this_00);
    return __return_storage_ptr__;
  }
  result<toml::detail::region,_toml::detail::none_t>::cleanup(&token,(EVP_PKEY_CTX *)ctx);
  location::reset((location *)this,f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"toml::parse_integer: ",(allocator<char> *)&local_258);
  source_location::source_location((source_location *)local_238,(location *)this);
  std::
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<toml::source_location,_const_char_(&)[33],_true>
            ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&iss,(source_location *)local_238,(char (*) [33])"the next token is not an integer")
  ;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&iss;
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_358,__l_02,(allocator_type *)&local_318);
  local_338._0_8_ = (pointer)0x0;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = (pointer)0x0;
  format_underline((string *)local_2a8,&str,
                   (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_358,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_338,false);
LAB_0012a77d:
  token._0_8_ = (long)&token.field_1 + 8;
  if (local_2a8 == (undefined1  [8])&local_2a0.source_) {
    token.field_1.succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         local_2a0.source_.
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
  }
  else {
    token._0_8_ = local_2a8;
  }
  token.field_1.succ.value.super_region_base._vptr_region_base =
       (region_base)(region_base)local_2a0.super_region_base._vptr_region_base;
  local_2a0.super_region_base._vptr_region_base = (_func_int **)0x0;
  local_2a0.source_.
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_1_ = '\0';
  local_2a8 = (undefined1  [8])&local_2a0.source_;
  result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::result(__return_storage_ptr__,(failure_type *)&token);
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::string::~string((string *)local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_338);
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_358);
  std::
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&iss);
  source_location::~source_location((source_location *)local_238);
  std::__cxx11::string::~string((string *)&str);
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<integer, region>, std::string>
parse_integer(location& loc)
{
    const auto first = loc.iter();
    if(first != loc.end() && *first == '0')
    {
        const auto second = std::next(first);
        if(second == loc.end()) // the token is just zero.
        {
            loc.advance();
            return ok(std::make_pair(0, region(loc, first, second)));
        }

        if(*second == 'b') {return parse_binary_integer     (loc);} // 0b1100
        if(*second == 'o') {return parse_octal_integer      (loc);} // 0o775
        if(*second == 'x') {return parse_hexadecimal_integer(loc);} // 0xC0FFEE

        if(std::isdigit(*second))
        {
            return err(format_underline("toml::parse_integer: "
                "leading zero in an Integer is not allowed.",
                {{source_location(loc), "leading zero"}}));
        }
        else if(std::isalpha(*second))
        {
             return err(format_underline("toml::parse_integer: "
                "unknown integer prefix appeared.",
                {{source_location(loc), "none of 0x, 0o, 0b"}}));
        }
    }

    if(const auto token = lex_dec_int::invoke(loc))
    {
        auto str = token.unwrap().str();
        str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

        std::istringstream iss(str);
        integer retval(0);
        iss >> retval;
        if(iss.fail())
        {
            // see parse_octal_integer for detail of this error message.
            loc.reset(first);
            return err(format_underline("toml::parse_integer:",
                       {{source_location(loc), "out of range"}}));
        }
        return ok(std::make_pair(retval, token.unwrap()));
    }
    loc.reset(first);
    return err(format_underline("toml::parse_integer: ",
               {{source_location(loc), "the next token is not an integer"}}));
}